

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

base_learner * Search::setup(options_i *options,vw *all)

{
  uint uVar1;
  undefined *puVar2;
  search_task *psVar3;
  search_metatask *psVar4;
  ulong __val;
  _func_void_search_ptr_size_t_ptr_options_i_ptr *p_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  char cVar9;
  char cVar10;
  int iVar11;
  uint uVar12;
  search *psVar13;
  search_private *psVar14;
  typed_option<unsigned_long> *ptVar15;
  typed_option<float> *ptVar16;
  vw_exception *pvVar17;
  polylabel *ppVar18;
  undefined **ppuVar19;
  typed_option<unsigned_int> *ptVar20;
  base_learner *base;
  clock_t cVar21;
  size_t sVar22;
  learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar23;
  ostream *poVar24;
  ulong uVar25;
  long lVar26;
  RollMethod RVar27;
  options_i *poVar28;
  _func_int **pp_Var29;
  label_parser *plVar30;
  byte bVar31;
  byte bVar32;
  float fVar33;
  string __str;
  string interpolation_string;
  string metatask_string;
  string task_string;
  stringstream __msg;
  option_group_definition new_options;
  string rollout_string;
  string rollin_string;
  uint32_t search_trained_nb_policies;
  string search_allowed_transitions;
  string neighbor_features_string;
  char *local_14e0;
  uint local_14d8;
  char local_14d0 [16];
  vw *local_14c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1478;
  options_i *local_1458;
  code *local_1450;
  search *local_1448;
  uint32_t *local_1440;
  undefined1 local_1438 [48];
  string local_1408 [64];
  bool local_13c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_13b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_13a0;
  size_t *local_12b0;
  option_group_definition local_12a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1250;
  size_t *local_1230;
  float *local_1228;
  float *local_1220;
  uint local_1214;
  undefined1 *local_1210 [2];
  undefined1 local_1200 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11d0;
  undefined1 *local_11b0;
  long local_11a8;
  undefined1 local_11a0 [16];
  undefined1 *local_1190 [2];
  undefined1 local_1180 [16];
  undefined1 *local_1170 [2];
  undefined1 local_1160 [16];
  string local_1150;
  string local_1130;
  string local_1110;
  string local_10f0;
  string local_10d0;
  string local_10b0;
  string local_1090;
  string local_1070;
  string local_1050;
  string local_1030;
  string local_1010;
  string local_ff0;
  string local_fd0;
  string local_fb0;
  string local_f90;
  string local_f70;
  string local_f50;
  string local_f30;
  string local_f10;
  string local_ef0;
  string local_ed0;
  string local_eb0;
  string local_e90;
  string local_e70;
  string local_e50;
  string local_e30;
  string local_e10;
  typed_option<unsigned_long> local_df0;
  typed_option<float> local_d50;
  typed_option<bool> local_cb0;
  typed_option<float> local_c10;
  typed_option<bool> local_b70;
  typed_option<bool> local_ad0;
  typed_option<unsigned_long> local_a30;
  typed_option<unsigned_long> local_990;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8f0;
  typed_option<float> local_850;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7b0;
  typed_option<unsigned_int> local_710;
  typed_option<unsigned_int> local_670;
  typed_option<float> local_5d0;
  typed_option<float> local_530;
  typed_option<unsigned_long> local_490;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_350;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  typed_option<unsigned_long> local_d0;
  
  bVar32 = 0;
  local_14c0 = all;
  local_1458 = options;
  psVar13 = calloc_or_throw<Search::search>(1);
  psVar14 = calloc_or_throw<Search::search_private>(1);
  psVar13->priv = psVar14;
  local_1450 = destroy_free<Search::search>;
  local_1478._M_dataplus._M_p = (pointer)&local_1478.field_2;
  local_1478._M_string_length = 0;
  local_1478.field_2._M_local_buf[0] = '\0';
  local_1498._M_dataplus._M_p = (pointer)&local_1498.field_2;
  local_1498._M_string_length = 0;
  local_1498.field_2._M_local_buf[0] = '\0';
  local_14b8._M_dataplus._M_p = (pointer)&local_14b8.field_2;
  local_1448 = psVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_14b8,"data","");
  local_11d0._M_dataplus._M_p = (pointer)&local_11d0.field_2;
  local_11d0._M_string_length = 0;
  local_11d0.field_2._M_local_buf[0] = '\0';
  local_1270._M_dataplus._M_p = (pointer)&local_1270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1270,"mix_per_state","");
  local_1250._M_dataplus._M_p = (pointer)&local_1250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1250,"mix_per_state","");
  local_11f0._M_dataplus._M_p = (pointer)&local_11f0.field_2;
  local_11f0._M_string_length = 0;
  local_11f0.field_2._M_local_buf[0] = '\0';
  psVar14->A = 1;
  local_11b0 = local_11a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_11b0,"Search options","");
  local_12a8.m_name._M_dataplus._M_p = (pointer)&local_12a8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_12a8,local_11b0,local_11b0 + local_11a8);
  local_12a8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_12a8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12a8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_11b0 != local_11a0) {
    operator_delete(local_11b0);
  }
  local_eb0._M_dataplus._M_p = (pointer)&local_eb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_eb0,"search","");
  local_12b0 = &psVar14->A;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_1438,&local_eb0,local_12b0);
  local_13c8 = true;
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,"Use learning to search, argument=maximum action id or 0 for LDF"
             ,"");
  std::__cxx11::string::_M_assign(local_1408);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_d0,(typed_option<unsigned_long> *)local_1438);
  VW::config::option_group_definition::add<unsigned_long>(&local_12a8,&local_d0);
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d16b8;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d16b8;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_eb0._M_dataplus._M_p != &local_eb0.field_2) {
    operator_delete(local_eb0._M_dataplus._M_p);
  }
  local_ed0._M_dataplus._M_p = (pointer)&local_ed0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ed0,"search_task","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1438,&local_ed0,&local_1478);
  local_13c8 = true;
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,
             "the search task (use \"--search_task list\" to get a list of available tasks)","");
  std::__cxx11::string::_M_assign(local_1408);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_170,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1438);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_12a8,&local_170);
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1680;
  if (local_170.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_170.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d1680;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ed0._M_dataplus._M_p != &local_ed0.field_2) {
    operator_delete(local_ed0._M_dataplus._M_p);
  }
  local_ef0._M_dataplus._M_p = (pointer)&local_ef0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ef0,"search_metatask","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1438,&local_ef0,&local_1498);
  local_13c8 = true;
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,
             "the search metatask (use \"--search_metatask list\" to get a list of available metatasks)"
             ,"");
  std::__cxx11::string::_M_assign(local_1408);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_210,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1438);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_12a8,&local_210);
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1680;
  if (local_210.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_210.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d1680;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ef0._M_dataplus._M_p != &local_ef0.field_2) {
    operator_delete(local_ef0._M_dataplus._M_p);
  }
  local_f10._M_dataplus._M_p = (pointer)&local_f10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f10,"search_interpolation","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1438,&local_f10,&local_14b8);
  local_13c8 = true;
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,"at what level should interpolation happen? [*data|policy]","");
  std::__cxx11::string::_M_assign(local_1408);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_2b0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1438);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_12a8,&local_2b0);
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1680;
  if (local_2b0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2b0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d1680;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f10._M_dataplus._M_p != &local_f10.field_2) {
    operator_delete(local_f10._M_dataplus._M_p);
  }
  local_f30._M_dataplus._M_p = (pointer)&local_f30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f30,"search_rollout","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1438,&local_f30,&local_1270);
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,
             "how should rollouts be executed?           [policy|oracle|*mix_per_state|mix_per_roll|none]"
             ,"");
  std::__cxx11::string::_M_assign(local_1408);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_350,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1438);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_12a8,&local_350);
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1680;
  if (local_350.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_350.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d1680;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f30._M_dataplus._M_p != &local_f30.field_2) {
    operator_delete(local_f30._M_dataplus._M_p);
  }
  local_f50._M_dataplus._M_p = (pointer)&local_f50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f50,"search_rollin","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1438,&local_f50,&local_1250);
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,
             "how should past trajectories be generated? [policy|oracle|*mix_per_state|mix_per_roll]"
             ,"");
  std::__cxx11::string::_M_assign(local_1408);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_3f0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1438);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_12a8,&local_3f0);
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1680;
  if (local_3f0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_3f0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d1680;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f50._M_dataplus._M_p != &local_f50.field_2) {
    operator_delete(local_f50._M_dataplus._M_p);
  }
  local_f70._M_dataplus._M_p = (pointer)&local_f70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f70,"search_passes_per_policy","");
  local_1230 = &psVar14->passes_per_policy;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_1438,&local_f70,local_1230);
  ptVar15 = VW::config::typed_option<unsigned_long>::default_value
                      ((typed_option<unsigned_long> *)local_1438,1);
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,
             "number of passes per policy (only valid for search_interpolation=policy)","");
  std::__cxx11::string::_M_assign((string *)&(ptVar15->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_490,ptVar15);
  VW::config::option_group_definition::add<unsigned_long>(&local_12a8,&local_490);
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d16b8;
  if (local_490.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_490.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d16b8;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f70._M_dataplus._M_p != &local_f70.field_2) {
    operator_delete(local_f70._M_dataplus._M_p);
  }
  local_f90._M_dataplus._M_p = (pointer)&local_f90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f90,"search_beta","");
  local_1220 = &psVar14->beta;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_1438,&local_f90,local_1220);
  ptVar16 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_1438,0.5);
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,
             "interpolation rate for policies (only valid for search_interpolation=policy)","");
  std::__cxx11::string::_M_assign((string *)&(ptVar16->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_530,ptVar16);
  VW::config::option_group_definition::add<float>(&local_12a8,&local_530);
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1760;
  if (local_530.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d1760;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f90._M_dataplus._M_p != &local_f90.field_2) {
    operator_delete(local_f90._M_dataplus._M_p);
  }
  local_fb0._M_dataplus._M_p = (pointer)&local_fb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fb0,"search_alpha","");
  local_1228 = &psVar14->alpha;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_1438,&local_fb0,local_1228);
  ptVar16 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_1438,1e-10);
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,
             "annealed beta = 1-(1-alpha)^t (only valid for search_interpolation=data)","");
  std::__cxx11::string::_M_assign((string *)&(ptVar16->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_5d0,ptVar16);
  VW::config::option_group_definition::add<float>(&local_12a8,&local_5d0);
  local_5d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1760;
  if (local_5d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_5d0.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d1760;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fb0._M_dataplus._M_p != &local_fb0.field_2) {
    operator_delete(local_fb0._M_dataplus._M_p);
  }
  local_fd0._M_dataplus._M_p = (pointer)&local_fd0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_fd0,"search_total_nb_policies","");
  local_1440 = &psVar14->total_number_of_policies;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_1438,&local_fd0,local_1440);
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,
             "if we are going to train the policies through multiple separate calls to vw, we need to specify this parameter and tell vw how many policies are eventually going to be trained"
             ,"");
  std::__cxx11::string::_M_assign(local_1408);
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_670,(typed_option<unsigned_int> *)local_1438);
  VW::config::option_group_definition::add<unsigned_int>(&local_12a8,&local_670);
  local_670.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1728;
  if (local_670.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_default_value.
               super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_670.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_670.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d1728;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fd0._M_dataplus._M_p != &local_fd0.field_2) {
    operator_delete(local_fd0._M_dataplus._M_p);
  }
  local_ff0._M_dataplus._M_p = (pointer)&local_ff0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ff0,"search_trained_nb_policies","");
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_1438,&local_ff0,&local_1214);
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,"the number of trained policies in a file","");
  std::__cxx11::string::_M_assign(local_1408);
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_710,(typed_option<unsigned_int> *)local_1438);
  VW::config::option_group_definition::add<unsigned_int>(&local_12a8,&local_710);
  local_710.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1728;
  if (local_710.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_default_value.
               super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_710.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_710.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d1728;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ff0._M_dataplus._M_p != &local_ff0.field_2) {
    operator_delete(local_ff0._M_dataplus._M_p);
  }
  local_1010._M_dataplus._M_p = (pointer)&local_1010.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1010,"search_allowed_transitions","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1438,&local_1010,&local_11f0);
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,
             "read file of allowed transitions [def: all transitions are allowed]","");
  std::__cxx11::string::_M_assign(local_1408);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_7b0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1438);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_12a8,&local_7b0);
  local_7b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1680;
  if (local_7b0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_7b0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_7b0.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d1680;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1010._M_dataplus._M_p != &local_1010.field_2) {
    operator_delete(local_1010._M_dataplus._M_p);
  }
  local_1030._M_dataplus._M_p = (pointer)&local_1030.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1030,"search_subsample_time","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_1438,&local_1030,&psVar14->subsample_timesteps);
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,
             "instead of training at all timesteps, use a subset. if value in (0,1), train on a random v%. if v>=1, train on precisely v steps per example, if v<=-1, use active learning"
             ,"");
  std::__cxx11::string::_M_assign(local_1408);
  VW::config::typed_option<float>::typed_option(&local_850,(typed_option<float> *)local_1438);
  VW::config::option_group_definition::add<float>(&local_12a8,&local_850);
  local_850.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1760;
  if (local_850.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_850.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_850.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d1760;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1030._M_dataplus._M_p != &local_1030.field_2) {
    operator_delete(local_1030._M_dataplus._M_p);
  }
  local_1050._M_dataplus._M_p = (pointer)&local_1050.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1050,"search_neighbor_features","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1438,&local_1050,&local_11d0);
  local_13c8 = true;
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,
             "copy features from neighboring lines. argument looks like: \'-1:a,+2\' meaning copy previous line namespace a and next next line from namespace _unnamed_, where \',\' separates them"
             ,"");
  std::__cxx11::string::_M_assign(local_1408);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_8f0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1438);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_12a8,&local_8f0);
  local_8f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1680;
  if (local_8f0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_8f0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_8f0.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d1680;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1050._M_dataplus._M_p != &local_1050.field_2) {
    operator_delete(local_1050._M_dataplus._M_p);
  }
  local_1070._M_dataplus._M_p = (pointer)&local_1070.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1070,"search_rollout_num_steps","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_1438,&local_1070,&psVar14->rollout_num_steps);
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,
             "how many calls of \"loss\" before we stop really predicting on rollouts and switch to oracle (default means \"infinite\")"
             ,"");
  std::__cxx11::string::_M_assign(local_1408);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_990,(typed_option<unsigned_long> *)local_1438);
  VW::config::option_group_definition::add<unsigned_long>(&local_12a8,&local_990);
  local_990.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d16b8;
  if (local_990.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_990.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_990.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_990.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_990.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d16b8;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1070._M_dataplus._M_p != &local_1070.field_2) {
    operator_delete(local_1070._M_dataplus._M_p);
  }
  local_1090._M_dataplus._M_p = (pointer)&local_1090.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1090,"search_history_length","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_1438,&local_1090,&psVar14->history_length);
  local_13c8 = true;
  ptVar15 = VW::config::typed_option<unsigned_long>::default_value
                      ((typed_option<unsigned_long> *)local_1438,1);
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,
             "some tasks allow you to specify how much history their depend on; specify that here",
             "");
  std::__cxx11::string::_M_assign((string *)&(ptVar15->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_a30,ptVar15);
  VW::config::option_group_definition::add<unsigned_long>(&local_12a8,&local_a30);
  local_a30.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d16b8;
  if (local_a30.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a30.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_a30.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a30.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_a30.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d16b8;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1090._M_dataplus._M_p != &local_1090.field_2) {
    operator_delete(local_1090._M_dataplus._M_p);
  }
  local_10b0._M_dataplus._M_p = (pointer)&local_10b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10b0,"search_no_caching","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1438,&local_10b0,&psVar14->no_caching);
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,
             "turn off the built-in caching ability (makes things slower, but technically more safe)"
             ,"");
  std::__cxx11::string::_M_assign(local_1408);
  VW::config::typed_option<bool>::typed_option(&local_ad0,(typed_option<bool> *)local_1438);
  VW::config::option_group_definition::add<bool>(&local_12a8,&local_ad0);
  local_ad0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1618;
  if (local_ad0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ad0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_ad0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ad0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_ad0.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d1618;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10b0._M_dataplus._M_p != &local_10b0.field_2) {
    operator_delete(local_10b0._M_dataplus._M_p);
  }
  local_10d0._M_dataplus._M_p = (pointer)&local_10d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10d0,"search_xv","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1438,&local_10d0,&psVar14->xv);
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,"train two separate policies, alternating prediction/learning",""
            );
  std::__cxx11::string::_M_assign(local_1408);
  VW::config::typed_option<bool>::typed_option(&local_b70,(typed_option<bool> *)local_1438);
  VW::config::option_group_definition::add<bool>(&local_12a8,&local_b70);
  local_b70.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1618;
  if (local_b70.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b70.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_b70.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b70.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_b70.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d1618;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10d0._M_dataplus._M_p != &local_10d0.field_2) {
    operator_delete(local_10d0._M_dataplus._M_p);
  }
  local_10f0._M_dataplus._M_p = (pointer)&local_10f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10f0,"search_perturb_oracle","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_1438,&local_10f0,&psVar14->perturb_oracle);
  ptVar16 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_1438,0.0);
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,"perturb the oracle on rollin with this probability","");
  std::__cxx11::string::_M_assign((string *)&(ptVar16->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_c10,ptVar16);
  VW::config::option_group_definition::add<float>(&local_12a8,&local_c10);
  local_c10.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1760;
  if (local_c10.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c10.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_c10.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c10.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_c10.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d1760;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10f0._M_dataplus._M_p != &local_10f0.field_2) {
    operator_delete(local_10f0._M_dataplus._M_p);
  }
  local_1110._M_dataplus._M_p = (pointer)&local_1110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1110,"search_linear_ordering","")
  ;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1438,&local_1110,&psVar14->linear_ordering);
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,
             "insist on generating examples in linear order (def: hoopla permutation)","");
  std::__cxx11::string::_M_assign(local_1408);
  VW::config::typed_option<bool>::typed_option(&local_cb0,(typed_option<bool> *)local_1438);
  VW::config::option_group_definition::add<bool>(&local_12a8,&local_cb0);
  local_cb0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1618;
  if (local_cb0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_cb0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_cb0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_cb0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_cb0.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d1618;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1110._M_dataplus._M_p != &local_1110.field_2) {
    operator_delete(local_1110._M_dataplus._M_p);
  }
  local_1130._M_dataplus._M_p = (pointer)&local_1130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1130,"search_active_verify","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_1438,&local_1130,&psVar14->active_csoaa_verify);
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,
             "verify that active learning is doing the right thing (arg = multiplier, should be = cost_range * range_c)"
             ,"");
  std::__cxx11::string::_M_assign(local_1408);
  VW::config::typed_option<float>::typed_option(&local_d50,(typed_option<float> *)local_1438);
  VW::config::option_group_definition::add<float>(&local_12a8,&local_d50);
  local_d50.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1760;
  if (local_d50.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d50.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d50.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d50.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d50.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d1760;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1130._M_dataplus._M_p != &local_1130.field_2) {
    operator_delete(local_1130._M_dataplus._M_p);
  }
  local_1150._M_dataplus._M_p = (pointer)&local_1150.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1150,"search_save_every_k_runs","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_1438,&local_1150,&psVar14->save_every_k_runs);
  local_14e0 = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14e0,"save model every k runs","");
  std::__cxx11::string::_M_assign(local_1408);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_df0,(typed_option<unsigned_long> *)local_1438);
  VW::config::option_group_definition::add<unsigned_long>(&local_12a8,&local_df0);
  local_df0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d16b8;
  if (local_df0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_df0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_df0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_df0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_df0.super_base_option);
  if (local_14e0 != local_14d0) {
    operator_delete(local_14e0);
  }
  local_1438._0_8_ = &PTR__typed_option_002d16b8;
  if (local_13a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a0._M_pi);
  }
  if (local_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1150._M_dataplus._M_p != &local_1150.field_2) {
    operator_delete(local_1150._M_dataplus._M_p);
  }
  poVar28 = local_1458;
  (**local_1458->_vptr_options_i)(local_1458,&local_12a8);
  pp_Var29 = (_func_int **)(local_1438 + 0x10);
  local_1438._0_8_ = pp_Var29;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1438,"search_task","");
  iVar11 = (*poVar28->_vptr_options_i[1])(poVar28,local_1438);
  if ((char)iVar11 == '\0') {
    if ((_func_int **)local_1438._0_8_ != pp_Var29) {
      operator_delete((void *)local_1438._0_8_);
    }
  }
  else {
    iVar11 = std::__cxx11::string::compare((char *)&local_1478);
    if ((_func_int **)local_1438._0_8_ != pp_Var29) {
      operator_delete((void *)local_1438._0_8_);
    }
    if (iVar11 != 0) {
      search_initialize(local_14c0,local_1448);
      parse_neighbor_features(&local_11d0,local_1448);
      iVar11 = std::__cxx11::string::compare((char *)&local_14b8);
      if (iVar11 == 0) {
        psVar14->allow_current_policy = true;
        psVar14->adaptive_beta = true;
        psVar14->passes_per_policy = local_14c0->numpasses;
        if (1 < psVar14->current_policy) {
          psVar14->current_policy = 1;
        }
      }
      else {
        iVar11 = std::__cxx11::string::compare((char *)&local_14b8);
        if (iVar11 != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1438);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1438 + 0x10),
                     "error: --search_interpolation must be \'data\' or \'policy\'",0x38);
          pvVar17 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (pvVar17,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                     ,0xac6,&local_e10);
          __cxa_throw(pvVar17,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
      }
      iVar11 = std::__cxx11::string::compare((char *)&local_1270);
      if ((iVar11 == 0) ||
         (iVar11 = std::__cxx11::string::compare((char *)&local_1270), iVar11 == 0)) {
        psVar14->rollout_method = POLICY;
      }
      else {
        iVar11 = std::__cxx11::string::compare((char *)&local_1270);
        if ((iVar11 == 0) ||
           (iVar11 = std::__cxx11::string::compare((char *)&local_1270), iVar11 == 0)) {
          psVar14->rollout_method = ORACLE;
        }
        else {
          iVar11 = std::__cxx11::string::compare((char *)&local_1270);
          if (iVar11 == 0) {
            psVar14->rollout_method = MIX_PER_STATE;
          }
          else {
            iVar11 = std::__cxx11::string::compare((char *)&local_1270);
            if ((iVar11 == 0) ||
               (iVar11 = std::__cxx11::string::compare((char *)&local_1270), iVar11 == 0)) {
              psVar14->rollout_method = MIX_PER_ROLL;
            }
            else {
              iVar11 = std::__cxx11::string::compare((char *)&local_1270);
              if (iVar11 != 0) {
                std::__cxx11::stringstream::stringstream((stringstream *)local_1438);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_1438 + 0x10),
                           "error: --search_rollout must be \'learn\', \'ref\', \'mix\', \'mix_per_state\' or \'none\'"
                           ,0x50);
                pvVar17 = (vw_exception *)__cxa_allocate_exception(0x38);
                std::__cxx11::stringbuf::str();
                VW::vw_exception::vw_exception
                          (pvVar17,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                           ,0xad6,&local_e30);
                __cxa_throw(pvVar17,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
              }
              psVar14->rollout_method = NO_ROLLOUT;
              psVar14->no_caching = true;
            }
          }
        }
      }
      iVar11 = std::__cxx11::string::compare((char *)&local_1250);
      RVar27 = POLICY;
      if ((iVar11 != 0) &&
         (iVar11 = std::__cxx11::string::compare((char *)&local_1250), iVar11 != 0)) {
        iVar11 = std::__cxx11::string::compare((char *)&local_1250);
        RVar27 = ORACLE;
        if ((iVar11 != 0) &&
           (iVar11 = std::__cxx11::string::compare((char *)&local_1250), iVar11 != 0)) {
          iVar11 = std::__cxx11::string::compare((char *)&local_1250);
          if (iVar11 == 0) {
            RVar27 = MIX_PER_STATE;
          }
          else {
            iVar11 = std::__cxx11::string::compare((char *)&local_1250);
            RVar27 = MIX_PER_ROLL;
            if ((iVar11 != 0) &&
               (iVar11 = std::__cxx11::string::compare((char *)&local_1250), iVar11 != 0)) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1438);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1438 + 0x10),
                         "error: --search_rollin must be \'learn\', \'ref\', \'mix\' or \'mix_per_state\'"
                         ,0x47);
              pvVar17 = (vw_exception *)__cxa_allocate_exception(0x38);
              std::__cxx11::stringbuf::str();
              VW::vw_exception::vw_exception
                        (pvVar17,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                         ,0xae1,&local_e50);
              __cxa_throw(pvVar17,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
            }
          }
        }
      }
      psVar14->rollin_method = RVar27;
      ppVar18 = calloc_or_throw<polylabel>(1);
      poVar28 = local_1458;
      psVar14->allowed_actions_cache = ppVar18;
      local_1438._0_8_ = local_1438 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1438,"cb","");
      iVar11 = (*poVar28->_vptr_options_i[1])(poVar28,local_1438);
      if ((undefined1 *)local_1438._0_8_ != local_1438 + 0x10) {
        operator_delete((void *)local_1438._0_8_);
      }
      psVar14->cb_learner = SUB41(iVar11,0);
      if (SUB41(iVar11,0) == false) {
        ppuVar19 = &COST_SENSITIVE::cs_label;
      }
      else {
        ppuVar19 = &CB::cb_label;
      }
      (*(code *)*ppuVar19)(psVar14->allowed_actions_cache);
      (psVar14->learn_losses).cs.costs.end_array = (wclass *)0x0;
      (psVar14->learn_losses).cs.costs.erase_count = 0;
      (psVar14->learn_losses).cs.costs._begin = (wclass *)0x0;
      (psVar14->learn_losses).cs.costs._end = (wclass *)0x0;
      (psVar14->gte_label).cs.costs._begin = (wclass *)0x0;
      (psVar14->gte_label).cs.costs._end = (wclass *)0x0;
      (psVar14->gte_label).cs.costs.end_array = (wclass *)0x0;
      (psVar14->gte_label).cs.costs.erase_count = 0;
      ensure_param(local_1220,0.0,1.0,0.5,"warning: search_beta must be in (0,1); resetting to 0.5")
      ;
      ensure_param(local_1228,0.0,1.0,1e-10,
                   "warning: search_alpha must be in (0,1); resetting to 1e-10");
      psVar14->num_calls_to_run = 0;
      uVar1 = psVar14->current_policy;
      uVar12 = uVar1;
      if (local_14c0->training == true) {
        fVar33 = ceilf((float)local_14c0->numpasses / (float)*local_1230);
        uVar12 = (int)fVar33 + uVar1;
      }
      if ((*local_1440 < uVar12) && (*local_1440 = uVar12, uVar1 != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "warning: you\'re attempting to train more classifiers than was allocated initially. Likely to cause bad performance."
                   ,0x73);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
        std::ostream::put('8');
        std::ostream::flush();
      }
      if ((local_14c0->training == false) && (psVar14->current_policy != 0)) {
        psVar14->current_policy = psVar14->current_policy - 1;
      }
      poVar28 = local_14c0->options;
      local_1438._0_8_ = local_1438 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1438,"search_trained_nb_policies","");
      uVar1 = psVar14->current_policy;
      cVar10 = '\x01';
      if (9 < uVar1) {
        uVar12 = uVar1;
        cVar9 = '\x04';
        do {
          cVar10 = cVar9;
          if (uVar12 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_00258ecd;
          }
          if (uVar12 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_00258ecd;
          }
          if (uVar12 < 10000) goto LAB_00258ecd;
          bVar8 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar9 = cVar10 + '\x04';
        } while (bVar8);
        cVar10 = cVar10 + '\x01';
      }
LAB_00258ecd:
      local_14e0 = local_14d0;
      std::__cxx11::string::_M_construct((ulong)&local_14e0,cVar10);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_14e0,local_14d8,uVar1);
      (*poVar28->_vptr_options_i[6])(poVar28,local_1438,&local_14e0);
      pp_Var29 = (_func_int **)(local_1438 + 0x10);
      if (local_14e0 != local_14d0) {
        operator_delete(local_14e0);
      }
      if ((_func_int **)local_1438._0_8_ != pp_Var29) {
        operator_delete((void *)local_1438._0_8_);
      }
      poVar28 = local_14c0->options;
      local_1438._0_8_ = pp_Var29;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1438,"search_trained_nb_policies","");
      ptVar20 = VW::config::options_i::get_typed_option<unsigned_int>(poVar28,(string *)local_1438);
      VW::config::typed_option<unsigned_int>::value(ptVar20,psVar14->current_policy);
      if ((_func_int **)local_1438._0_8_ != pp_Var29) {
        operator_delete((void *)local_1438._0_8_);
      }
      poVar28 = local_14c0->options;
      local_1438._0_8_ = pp_Var29;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1438,"search_total_nb_policies","");
      uVar1 = *local_1440;
      cVar10 = '\x01';
      if (9 < uVar1) {
        uVar12 = uVar1;
        cVar9 = '\x04';
        do {
          cVar10 = cVar9;
          if (uVar12 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_0025900b;
          }
          if (uVar12 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_0025900b;
          }
          if (uVar12 < 10000) goto LAB_0025900b;
          bVar8 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar9 = cVar10 + '\x04';
        } while (bVar8);
        cVar10 = cVar10 + '\x01';
      }
LAB_0025900b:
      local_14e0 = local_14d0;
      std::__cxx11::string::_M_construct((ulong)&local_14e0,cVar10);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_14e0,local_14d8,uVar1);
      (*poVar28->_vptr_options_i[6])(poVar28,local_1438,&local_14e0);
      pp_Var29 = (_func_int **)(local_1438 + 0x10);
      if (local_14e0 != local_14d0) {
        operator_delete(local_14e0);
      }
      if ((_func_int **)local_1438._0_8_ != pp_Var29) {
        operator_delete((void *)local_1438._0_8_);
      }
      poVar28 = local_14c0->options;
      local_1438._0_8_ = pp_Var29;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1438,"search_total_nb_policies","");
      ptVar20 = VW::config::options_i::get_typed_option<unsigned_int>(poVar28,(string *)local_1438);
      VW::config::typed_option<unsigned_int>::value(ptVar20,*local_1440);
      if ((_func_int **)local_1438._0_8_ != pp_Var29) {
        operator_delete((void *)local_1438._0_8_);
      }
      iVar11 = std::__cxx11::string::compare((char *)&local_1478);
      if (iVar11 == 0) {
        poVar24 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar24,"available search tasks:",0x17);
        std::endl<char,std::char_traits<char>>(poVar24);
        if (all_tasks != (undefined *)0x0) {
          ppuVar19 = &PTR_task_002d5b98;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  ",2);
            poVar24 = std::operator<<((ostream *)&std::cerr,*(char **)ppuVar19[-1]);
            std::endl<char,std::char_traits<char>>(poVar24);
            puVar2 = *ppuVar19;
            ppuVar19 = ppuVar19 + 1;
          } while (puVar2 != (undefined *)0x0);
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_00259924:
        exit(0);
      }
      iVar11 = std::__cxx11::string::compare((char *)&local_1498);
      if (iVar11 == 0) {
        poVar24 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar24,"available search metatasks:",0x1b);
        std::endl<char,std::char_traits<char>>(poVar24);
        if (all_metatasks != (undefined *)0x0) {
          ppuVar19 = &PTR_metatask_002d5bf8;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  ",2);
            poVar24 = std::operator<<((ostream *)&std::cerr,*(char **)ppuVar19[-1]);
            std::endl<char,std::char_traits<char>>(poVar24);
            puVar2 = *ppuVar19;
            ppuVar19 = ppuVar19 + 1;
          } while (puVar2 != (undefined *)0x0);
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_00259924;
      }
      if (all_tasks != (undefined *)0x0) {
        ppuVar19 = &PTR_task_002d5b98;
        do {
          iVar11 = std::__cxx11::string::compare((char *)&local_1478);
          if (iVar11 == 0) {
            psVar3 = (search_task *)ppuVar19[-1];
            psVar14->task = psVar3;
            local_1448->task_name = psVar3->task_name;
            break;
          }
          puVar2 = *ppuVar19;
          ppuVar19 = ppuVar19 + 1;
        } while (puVar2 != (undefined *)0x0);
      }
      if (psVar14->task == (search_task *)0x0) {
        local_1438._0_8_ = pp_Var29;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1438,"help","");
        iVar11 = (*local_1458->_vptr_options_i[1])(local_1458,local_1438);
        if ((undefined1 *)local_1438._0_8_ != local_1438 + 0x10) {
          operator_delete((void *)local_1438._0_8_);
        }
        if ((char)iVar11 == '\0') {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1438);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1438 + 0x10),"fail: unknown task for --search_task \'",0x26);
          poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_1438 + 0x10),local_1478._M_dataplus._M_p,
                               local_1478._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar24,"\'; use --search_task list to get a list",0x27);
          pvVar17 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (pvVar17,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                     ,0xb36,&local_e70);
          __cxa_throw(pvVar17,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
      }
      psVar14->metatask = (search_metatask *)0x0;
      if (all_metatasks != (undefined *)0x0) {
        ppuVar19 = &PTR_metatask_002d5bf8;
        do {
          iVar11 = std::__cxx11::string::compare((char *)&local_1498);
          if (iVar11 == 0) {
            psVar4 = (search_metatask *)ppuVar19[-1];
            psVar14->metatask = psVar4;
            local_1448->metatask_name = psVar4->metatask_name;
            break;
          }
          puVar2 = *ppuVar19;
          ppuVar19 = ppuVar19 + 1;
        } while (puVar2 != (undefined *)0x0);
      }
      local_14c0->p->emptylines_separate_examples = true;
      local_1438._0_8_ = local_1438 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1438,"csoaa","");
      poVar28 = local_1458;
      iVar11 = (*local_1458->_vptr_options_i[1])(local_1458,local_1438);
      if ((char)iVar11 == '\0') {
        local_14e0 = local_14d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_14e0,"cs_active","");
        iVar11 = (*poVar28->_vptr_options_i[1])(poVar28,&local_14e0);
        if ((char)iVar11 == '\0') {
          local_1210[0] = local_1200;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1210,"csoaa_ldf","");
          iVar11 = (*local_1458->_vptr_options_i[1])(local_1458,local_1210);
          if ((char)iVar11 == '\0') {
            local_1170[0] = local_1160;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1170,"wap_ldf","");
            iVar11 = (*local_1458->_vptr_options_i[1])(local_1458,local_1170);
            if ((char)iVar11 == '\0') {
              local_1190[0] = local_1180;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1190,"cb","");
              iVar11 = (*local_1458->_vptr_options_i[1])(local_1458,local_1190);
              if (local_1190[0] != local_1180) {
                operator_delete(local_1190[0]);
              }
              bVar31 = (byte)iVar11 ^ 1;
            }
            else {
              bVar31 = 0;
            }
            if (local_1170[0] != local_1160) {
              operator_delete(local_1170[0]);
            }
          }
          else {
            bVar31 = 0;
          }
          poVar28 = local_1458;
          if (local_1210[0] != local_1200) {
            operator_delete(local_1210[0]);
            poVar28 = local_1458;
          }
        }
        else {
          bVar31 = 0;
        }
        if (local_14e0 != local_14d0) {
          operator_delete(local_14e0);
        }
      }
      else {
        bVar31 = 0;
      }
      pp_Var29 = (_func_int **)(local_1438 + 0x10);
      if ((_func_int **)local_1438._0_8_ != pp_Var29) {
        operator_delete((void *)local_1438._0_8_);
      }
      if (bVar31 != 0) {
        local_1438._0_8_ = pp_Var29;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1438,"csoaa","");
        __val = *local_12b0;
        cVar10 = '\x01';
        if (9 < __val) {
          uVar25 = __val;
          cVar9 = '\x04';
          do {
            cVar10 = cVar9;
            if (uVar25 < 100) {
              cVar10 = cVar10 + -2;
              goto LAB_00259466;
            }
            if (uVar25 < 1000) {
              cVar10 = cVar10 + -1;
              goto LAB_00259466;
            }
            if (uVar25 < 10000) goto LAB_00259466;
            bVar8 = 99999 < uVar25;
            uVar25 = uVar25 / 10000;
            cVar9 = cVar10 + '\x04';
          } while (bVar8);
          cVar10 = cVar10 + '\x01';
        }
LAB_00259466:
        local_14e0 = local_14d0;
        std::__cxx11::string::_M_construct((ulong)&local_14e0,cVar10);
        std::__detail::__to_chars_10_impl<unsigned_long>(local_14e0,local_14d8,__val);
        (*local_1458->_vptr_options_i[5])(local_1458,local_1438,&local_14e0);
        if (local_14e0 != local_14d0) {
          operator_delete(local_14e0);
        }
        poVar28 = local_1458;
        if ((_func_int **)local_1438._0_8_ != pp_Var29) {
          operator_delete((void *)local_1438._0_8_);
        }
      }
      local_1438._0_8_ = pp_Var29;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1438,"cs_active","");
      iVar11 = (*poVar28->_vptr_options_i[1])(poVar28,local_1438);
      psVar14->active_csoaa = SUB41(iVar11,0);
      if ((_func_int **)local_1438._0_8_ != pp_Var29) {
        operator_delete((void *)local_1438._0_8_);
      }
      psVar14->active_csoaa_verify = -1.0;
      local_1438._0_8_ = pp_Var29;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1438,"search_active_verify","");
      iVar11 = (*poVar28->_vptr_options_i[1])(poVar28,local_1438);
      if ((undefined1 *)local_1438._0_8_ != local_1438 + 0x10) {
        operator_delete((void *)local_1438._0_8_);
      }
      if (((char)iVar11 != '\0') && (psVar14->active_csoaa == false)) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1438);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1438 + 0x10),
                   "cannot use --search_active_verify without using --cs_active",0x3b);
        pvVar17 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar17,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                   ,0xb4c,&local_e90);
        __cxa_throw(pvVar17,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      base = setup_base(local_14c0->options,local_14c0);
      ppuVar19 = &MULTICLASS::mc_label;
      plVar30 = &local_14c0->p->lp;
      for (lVar26 = 9; lVar26 != 0; lVar26 = lVar26 + -1) {
        plVar30->default_label = (_func_void_void_ptr *)*ppuVar19;
        ppuVar19 = ppuVar19 + (ulong)bVar32 * -2 + 1;
        plVar30 = (label_parser *)((long)plVar30 + (ulong)bVar32 * -0x10 + 8);
      }
      local_14c0->label_type = mc;
      if ((psVar14->task != (search_task *)0x0) &&
         (p_Var5 = psVar14->task->initialize,
         p_Var5 != (_func_void_search_ptr_size_t_ptr_options_i_ptr *)0x0)) {
        (*p_Var5)(local_1448,local_12b0,poVar28);
      }
      if ((psVar14->metatask != (search_metatask *)0x0) &&
         (p_Var5 = psVar14->metatask->initialize,
         p_Var5 != (_func_void_search_ptr_size_t_ptr_options_i_ptr *)0x0)) {
        (*p_Var5)(local_1448,local_12b0,poVar28);
      }
      psVar14->meta_t = 0;
      local_1438._0_8_ = local_1438 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1438,"search_allowed_transitions","");
      iVar11 = (*poVar28->_vptr_options_i[1])(poVar28,local_1438);
      if ((undefined1 *)local_1438._0_8_ != local_1438 + 0x10) {
        operator_delete((void *)local_1438._0_8_);
      }
      if ((char)iVar11 != '\0') {
        read_allowed_transitions
                  ((v_array<COST_SENSITIVE::label> *)local_1438,(action)*local_12b0,
                   local_11f0._M_dataplus._M_p);
      }
      handle_condition_options(local_14c0,&psVar14->acset);
      if (psVar14->allow_current_policy == false) {
        local_14c0->check_holdout_every_n_passes = *local_1230;
      }
      local_14c0->searchstr = &local_1450;
      cVar21 = clock();
      psVar14->start_clock_time = cVar21;
      sVar22 = psVar14->num_learners;
      if (psVar14->xv == true) {
        sVar22 = sVar22 * 3;
        psVar14->num_learners = sVar22;
      }
      plVar23 = LEARNER::learner<Search::search,std::vector<example*,std::allocator<example*>>>::
                init_learner<LEARNER::learner<char,char>>
                          (local_1448,base,do_actual_learning<true>,do_actual_learning<false>,
                           *local_1440 * sVar22,*(prediction_type_t *)(base + 0xd0));
      local_1448 = (search *)0x0;
      uVar6 = *(undefined8 *)(plVar23 + 0x18);
      uVar7 = *(undefined8 *)(plVar23 + 0x20);
      *(undefined8 *)(plVar23 + 0x58) = uVar6;
      *(code **)(plVar23 + 0x68) = finish_multiline_example;
      *(undefined8 *)(plVar23 + 0xa0) = uVar6;
      *(undefined8 *)(plVar23 + 0xa8) = uVar7;
      *(code **)(plVar23 + 0xb0) = end_examples;
      *(undefined8 *)(plVar23 + 0xb8) = uVar6;
      *(undefined8 *)(plVar23 + 0xc0) = uVar7;
      *(code **)(plVar23 + 200) = search_finish;
      *(undefined8 *)(plVar23 + 0x88) = uVar6;
      *(undefined8 *)(plVar23 + 0x90) = uVar7;
      *(code **)(plVar23 + 0x98) = end_pass;
      goto LAB_002597aa;
    }
  }
  plVar23 = (learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
LAB_002597aa:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_12a8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12a8.m_name._M_dataplus._M_p != &local_12a8.m_name.field_2) {
    operator_delete(local_12a8.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11f0._M_dataplus._M_p != &local_11f0.field_2) {
    operator_delete(local_11f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1250._M_dataplus._M_p != &local_1250.field_2) {
    operator_delete(local_1250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1270._M_dataplus._M_p != &local_1270.field_2) {
    operator_delete(local_1270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11d0._M_dataplus._M_p != &local_11d0.field_2) {
    operator_delete(local_11d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14b8._M_dataplus._M_p != &local_14b8.field_2) {
    operator_delete(local_14b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1498._M_dataplus._M_p != &local_1498.field_2) {
    operator_delete(local_1498._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1478._M_dataplus._M_p != &local_1478.field_2) {
    operator_delete(local_1478._M_dataplus._M_p);
  }
  if (local_1448 != (search *)0x0) {
    (*local_1450)();
  }
  return (base_learner *)plVar23;
}

Assistant:

base_learner* setup(options_i& options, vw& all)
{
  free_ptr<search> sch = scoped_calloc_or_throw<search>();
  search_private& priv = *sch->priv;
  std::string task_string;
  std::string metatask_string;
  std::string interpolation_string = "data";
  std::string neighbor_features_string;
  std::string rollout_string = "mix_per_state";
  std::string rollin_string = "mix_per_state";

  uint32_t search_trained_nb_policies;
  std::string search_allowed_transitions;

  priv.A = 1;
  option_group_definition new_options("Search options");
  new_options.add(
      make_option("search", priv.A).keep().help("Use learning to search, argument=maximum action id or 0 for LDF"));
  new_options.add(make_option("search_task", task_string)
                      .keep()
                      .help("the search task (use \"--search_task list\" to get a list of available tasks)"));
  new_options.add(
      make_option("search_metatask", metatask_string)
          .keep()
          .help("the search metatask (use \"--search_metatask list\" to get a list of available metatasks)"));
  new_options.add(make_option("search_interpolation", interpolation_string)
                      .keep()
                      .help("at what level should interpolation happen? [*data|policy]"));
  new_options.add(
      make_option("search_rollout", rollout_string)
          .help("how should rollouts be executed?           [policy|oracle|*mix_per_state|mix_per_roll|none]"));
  new_options.add(make_option("search_rollin", rollin_string)
                      .help("how should past trajectories be generated? [policy|oracle|*mix_per_state|mix_per_roll]"));
  new_options.add(make_option("search_passes_per_policy", priv.passes_per_policy)
                      .default_value(1)
                      .help("number of passes per policy (only valid for search_interpolation=policy)"));
  new_options.add(make_option("search_beta", priv.beta)
                      .default_value(0.5f)
                      .help("interpolation rate for policies (only valid for search_interpolation=policy)"));
  new_options.add(make_option("search_alpha", priv.alpha)
                      .default_value(1e-10f)
                      .help("annealed beta = 1-(1-alpha)^t (only valid for search_interpolation=data)"));
  new_options.add(make_option("search_total_nb_policies", priv.total_number_of_policies)
                      .help("if we are going to train the policies through multiple separate calls to vw, we need to "
                            "specify this parameter and tell vw how many policies are eventually going to be trained"));
  new_options.add(make_option("search_trained_nb_policies", search_trained_nb_policies)
                      .help("the number of trained policies in a file"));
  new_options.add(make_option("search_allowed_transitions", search_allowed_transitions)
                      .help("read file of allowed transitions [def: all transitions are allowed]"));
  new_options.add(make_option("search_subsample_time", priv.subsample_timesteps)
                      .help("instead of training at all timesteps, use a subset. if value in (0,1), train on a random "
                            "v%. if v>=1, train on precisely v steps per example, if v<=-1, use active learning"));
  new_options.add(
      make_option("search_neighbor_features", neighbor_features_string)
          .keep()
          .help("copy features from neighboring lines. argument looks like: '-1:a,+2' meaning copy previous line "
                "namespace a and next next line from namespace _unnamed_, where ',' separates them"));
  new_options.add(make_option("search_rollout_num_steps", priv.rollout_num_steps)
                      .help("how many calls of \"loss\" before we stop really predicting on rollouts and switch to "
                            "oracle (default means \"infinite\")"));
  new_options.add(make_option("search_history_length", priv.history_length)
                      .keep()
                      .default_value(1)
                      .help("some tasks allow you to specify how much history their depend on; specify that here"));
  new_options.add(make_option("search_no_caching", priv.no_caching)
                      .help("turn off the built-in caching ability (makes things slower, but technically more safe)"));
  new_options.add(
      make_option("search_xv", priv.xv).help("train two separate policies, alternating prediction/learning"));
  new_options.add(make_option("search_perturb_oracle", priv.perturb_oracle)
                      .default_value(0.f)
                      .help("perturb the oracle on rollin with this probability"));
  new_options.add(make_option("search_linear_ordering", priv.linear_ordering)
                      .help("insist on generating examples in linear order (def: hoopla permutation)"));
  new_options.add(make_option("search_active_verify", priv.active_csoaa_verify)
                      .help("verify that active learning is doing the right thing (arg = multiplier, should be = "
                            "cost_range * range_c)"));
  new_options.add(make_option("search_save_every_k_runs", priv.save_every_k_runs).help("save model every k runs"));
  options.add_and_parse(new_options);

  // If hook was passed as the search_task then do not activate reduction. This task can only be used in library form.
  if (!options.was_supplied("search_task") || task_string == "hook")
    return nullptr;

  search_initialize(&all, *sch.get());

  parse_neighbor_features(neighbor_features_string, *sch.get());

  if (interpolation_string.compare("data") == 0)  // run as dagger
  {
    priv.adaptive_beta = true;
    priv.allow_current_policy = true;
    priv.passes_per_policy = all.numpasses;
    if (priv.current_policy > 1)
      priv.current_policy = 1;
  }
  else if (interpolation_string.compare("policy") == 0)
    ;
  else
    THROW("error: --search_interpolation must be 'data' or 'policy'");

  if ((rollout_string.compare("policy") == 0) || (rollout_string.compare("learn") == 0))
    priv.rollout_method = POLICY;
  else if ((rollout_string.compare("oracle") == 0) || (rollout_string.compare("ref") == 0))
    priv.rollout_method = ORACLE;
  else if ((rollout_string.compare("mix_per_state") == 0))
    priv.rollout_method = MIX_PER_STATE;
  else if ((rollout_string.compare("mix_per_roll") == 0) || (rollout_string.compare("mix") == 0))
    priv.rollout_method = MIX_PER_ROLL;
  else if ((rollout_string.compare("none") == 0))
  {
    priv.rollout_method = NO_ROLLOUT;
    priv.no_caching = true;
  }
  else
    THROW("error: --search_rollout must be 'learn', 'ref', 'mix', 'mix_per_state' or 'none'");

  if ((rollin_string.compare("policy") == 0) || (rollin_string.compare("learn") == 0))
    priv.rollin_method = POLICY;
  else if ((rollin_string.compare("oracle") == 0) || (rollin_string.compare("ref") == 0))
    priv.rollin_method = ORACLE;
  else if ((rollin_string.compare("mix_per_state") == 0))
    priv.rollin_method = MIX_PER_STATE;
  else if ((rollin_string.compare("mix_per_roll") == 0) || (rollin_string.compare("mix") == 0))
    priv.rollin_method = MIX_PER_ROLL;
  else
    THROW("error: --search_rollin must be 'learn', 'ref', 'mix' or 'mix_per_state'");

  // check if the base learner is contextual bandit, in which case, we dont rollout all actions.
  priv.allowed_actions_cache = &calloc_or_throw<polylabel>();
  if (options.was_supplied("cb"))
  {
    priv.cb_learner = true;
    CB::cb_label.default_label(priv.allowed_actions_cache);
    priv.learn_losses.cb.costs = v_init<CB::cb_class>();
    priv.gte_label.cb.costs = v_init<CB::cb_class>();
  }
  else
  {
    priv.cb_learner = false;
    CS::cs_label.default_label(priv.allowed_actions_cache);
    priv.learn_losses.cs.costs = v_init<CS::wclass>();
    priv.gte_label.cs.costs = v_init<CS::wclass>();
  }

  ensure_param(priv.beta, 0.0, 1.0, 0.5, "warning: search_beta must be in (0,1); resetting to 0.5");
  ensure_param(priv.alpha, 0.0, 1.0, 1e-10f, "warning: search_alpha must be in (0,1); resetting to 1e-10");

  priv.num_calls_to_run = 0;

  // compute total number of policies we will have at end of training
  // we add current_policy for cases where we start from an initial set of policies loaded through -i option
  uint32_t tmp_number_of_policies = priv.current_policy;
  if (all.training)
    tmp_number_of_policies += (int)ceil(((float)all.numpasses) / ((float)priv.passes_per_policy));

  // the user might have specified the number of policies that will eventually be trained through multiple vw calls,
  // so only set total_number_of_policies to computed value if it is larger
  cdbg << "current_policy=" << priv.current_policy << " tmp_number_of_policies=" << tmp_number_of_policies
       << " total_number_of_policies=" << priv.total_number_of_policies << endl;
  if (tmp_number_of_policies > priv.total_number_of_policies)
  {
    priv.total_number_of_policies = tmp_number_of_policies;
    if (priv.current_policy >
        0)  // we loaded a file but total number of policies didn't match what is needed for training
      std::cerr << "warning: you're attempting to train more classifiers than was allocated initially. Likely to cause "
                   "bad performance."
                << endl;
  }

  // current policy currently points to a new policy we would train
  // if we are not training and loaded a bunch of policies for testing, we need to subtract 1 from current policy
  // so that we only use those loaded when testing (as run_prediction is called with allow_current to true)
  if (!all.training && priv.current_policy > 0)
    priv.current_policy--;

  all.options->replace("search_trained_nb_policies", std::to_string(priv.current_policy));
  all.options->get_typed_option<uint32_t>("search_trained_nb_policies").value(priv.current_policy);

  all.options->replace("search_total_nb_policies", std::to_string(priv.total_number_of_policies));
  all.options->get_typed_option<uint32_t>("search_total_nb_policies").value(priv.total_number_of_policies);

  cdbg << "search current_policy = " << priv.current_policy
       << " total_number_of_policies = " << priv.total_number_of_policies << endl;

  if (task_string.compare("list") == 0)
  {
    std::cerr << endl << "available search tasks:" << endl;
    for (search_task** mytask = all_tasks; *mytask != nullptr; mytask++)
      std::cerr << "  " << (*mytask)->task_name << endl;
    std::cerr << endl;
    exit(0);
  }
  if (metatask_string.compare("list") == 0)
  {
    std::cerr << endl << "available search metatasks:" << endl;
    for (search_metatask** mytask = all_metatasks; *mytask != nullptr; mytask++)
      std::cerr << "  " << (*mytask)->metatask_name << endl;
    std::cerr << endl;
    exit(0);
  }
  for (search_task** mytask = all_tasks; *mytask != nullptr; mytask++)
    if (task_string.compare((*mytask)->task_name) == 0)
    {
      priv.task = *mytask;
      sch->task_name = (*mytask)->task_name;
      break;
    }
  if (priv.task == nullptr)
  {
    if (!options.was_supplied("help"))
      THROW("fail: unknown task for --search_task '" << task_string << "'; use --search_task list to get a list");
  }
  priv.metatask = nullptr;
  for (search_metatask** mytask = all_metatasks; *mytask != nullptr; mytask++)
    if (metatask_string.compare((*mytask)->metatask_name) == 0)
    {
      priv.metatask = *mytask;
      sch->metatask_name = (*mytask)->metatask_name;
      break;
    }
  all.p->emptylines_separate_examples = true;

  if (!options.was_supplied("csoaa") && !options.was_supplied("cs_active") && !options.was_supplied("csoaa_ldf") &&
      !options.was_supplied("wap_ldf") && !options.was_supplied("cb"))
  {
    options.insert("csoaa", std::to_string(priv.A));
  }

  priv.active_csoaa = options.was_supplied("cs_active");
  priv.active_csoaa_verify = -1.;
  if (options.was_supplied("search_active_verify"))
    if (!priv.active_csoaa)
      THROW("cannot use --search_active_verify without using --cs_active");

  cdbg << "active_csoaa = " << priv.active_csoaa << ", active_csoaa_verify = " << priv.active_csoaa_verify << endl;

  base_learner* base = setup_base(*all.options, all);

  // default to OAA labels unless the task wants to override this (which they can do in initialize)
  all.p->lp = MC::mc_label;
  all.label_type = label_type::mc;
  if (priv.task && priv.task->initialize)
    priv.task->initialize(*sch.get(), priv.A, options);
  if (priv.metatask && priv.metatask->initialize)
    priv.metatask->initialize(*sch.get(), priv.A, options);
  priv.meta_t = 0;

  if (options.was_supplied("search_allowed_transitions"))
    read_allowed_transitions((action)priv.A, search_allowed_transitions.c_str());

  // set up auto-history (used to only do this if AUTO_CONDITION_FEATURES was on, but that doesn't work for hooktask)
  handle_condition_options(all, priv.acset);

  if (!priv.allow_current_policy)  // if we're not dagger
    all.check_holdout_every_n_passes = priv.passes_per_policy;

  all.searchstr = &sch;

  priv.start_clock_time = clock();

  if (priv.xv)
    priv.num_learners *= 3;

  cdbg << "num_learners = " << priv.num_learners << endl;

  learner<search, multi_ex>& l = init_learner(sch, make_base(*base), do_actual_learning<true>,
      do_actual_learning<false>, priv.total_number_of_policies * priv.num_learners);
  l.set_finish_example(finish_multiline_example);
  l.set_end_examples(end_examples);
  l.set_finish(search_finish);
  l.set_end_pass(end_pass);
  return make_base(l);
}